

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetrahedron_monte_carlo.cpp
# Opt level: O2

double * monomial_value(int m,int n,int *e,double *x)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  double *local_38;
  
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (ulong)(uint)n << 3;
  }
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  pdVar2 = (double *)operator_new__(uVar3);
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pdVar2[uVar4] = 1.0;
  }
  uVar4 = 0;
  uVar3 = 0;
  local_38 = x;
  if (0 < m) {
    uVar3 = (ulong)(uint)m;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    if (e[uVar4] != 0) {
      pdVar6 = local_38;
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        dVar1 = pdVar2[uVar7];
        dVar8 = pow(*pdVar6,(double)e[uVar4]);
        pdVar2[uVar7] = dVar8 * dVar1;
        pdVar6 = pdVar6 + m;
      }
    }
    local_38 = local_38 + 1;
  }
  return pdVar2;
}

Assistant:

double *monomial_value ( int m, int n, int e[], double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    MONOMIAL_VALUE evaluates a monomial.
//
//  Discussion:
//
//    This routine evaluates a monomial of the form
//
//      product ( 1 <= i <= m ) x(i)^e(i)
//
//    where the exponents are nonnegative integers.  Note that
//    if the combination 0^0 is encountered, it should be treated
//    as 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 May 2007
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the spatial dimension.
//
//    Input, int POINT_NUM, the number of points at which the
//    monomial is to be evaluated.
//
//    Input, int E[M], the exponents.
//
//    Input, double X[M*N], the point coordinates.
//
//    Output, double MONOMIAL_VALUE[N], the value of the monomial.
//
{
  int i;
  int j;
  double *v;

  v = new double[n];

  for ( j = 0; j < n; j++ )
  {
    v[j] = 1.0;
  }

  for ( i = 0; i < m; i++ )
  {
    if ( 0 != e[i] )
    {
      for ( j = 0; j < n; j++ )
      {
        v[j] = v[j] * pow ( x[i+j*m], e[i] );
      }
    }
  }

  return v;
}